

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

iterator cs_impl::list_cs_ext::insert(list *lst,iterator *pos,var *val)

{
  iterator *in_RSI;
  const_iterator in_RDI;
  value_type *in_stack_ffffffffffffff98;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffa0;
  EVP_PKEY_CTX local_38 [8];
  EVP_PKEY_CTX local_30 [8];
  _List_const_iterator<cs_impl::any> local_28 [4];
  _List_node_base *local_8;
  
  std::_List_const_iterator<cs_impl::any>::_List_const_iterator(local_28,in_RSI);
  any::any((any *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  cs::copy(local_30,local_38);
  local_8 = (_List_node_base *)
            std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::insert
                      (in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff98);
  any::~any((any *)0x435440);
  any::~any((any *)0x43544a);
  return (iterator)local_8;
}

Assistant:

list::iterator insert(list &lst, list::iterator &pos, const var &val)
		{
			return lst.insert(pos, copy(val));
		}